

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setType(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,Type tp)

{
  SPxOut *pSVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int32_t iVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  char *pcVar12;
  Verbosity old_verbosity;
  undefined1 local_24 [4];
  
  if (this->theType != tp) {
    this->theType = tp;
    pcVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
    uVar3 = (pcVar11->data)._M_elems[1];
    uVar4 = (pcVar11->data)._M_elems[2];
    uVar5 = (pcVar11->data)._M_elems[3];
    uVar6 = (pcVar11->data)._M_elems[4];
    uVar7 = (pcVar11->data)._M_elems[5];
    uVar8 = (pcVar11->data)._M_elems[6];
    uVar9 = (pcVar11->data)._M_elems[7];
    (this->m_nonbasicValue).m_backend.data._M_elems[0] = (pcVar11->data)._M_elems[0];
    (this->m_nonbasicValue).m_backend.data._M_elems[1] = uVar3;
    (this->m_nonbasicValue).m_backend.data._M_elems[2] = uVar4;
    (this->m_nonbasicValue).m_backend.data._M_elems[3] = uVar5;
    (this->m_nonbasicValue).m_backend.data._M_elems[4] = uVar6;
    (this->m_nonbasicValue).m_backend.data._M_elems[5] = uVar7;
    (this->m_nonbasicValue).m_backend.data._M_elems[6] = uVar8;
    (this->m_nonbasicValue).m_backend.data._M_elems[7] = uVar9;
    *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) =
         *(undefined8 *)((pcVar11->data)._M_elems + 8);
    (this->m_nonbasicValue).m_backend.exp = pcVar11->exp;
    (this->m_nonbasicValue).m_backend.neg = pcVar11->neg;
    iVar10 = pcVar11->prec_elem;
    (this->m_nonbasicValue).m_backend.fpclass = pcVar11->fpclass;
    (this->m_nonbasicValue).m_backend.prec_elem = iVar10;
    this->m_nonbasicValueUpToDate = false;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x77])(this);
    pSVar1 = this->spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"Switching to ",0xd);
      pcVar12 = "entering";
      if (tp == LEAVE) {
        pcVar12 = "leaving";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],pcVar12,(ulong)(tp != LEAVE) + 7);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," algorithm",10);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_24);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setType(Type tp)
{

   if(theType != tp)
   {
      theType = tp;

      forceRecompNonbasicValue();

      unInit();
#if 0
      else
      {
         if(!matrixIsSetup)
         {
            SPxBasisBase<R>::load(this);
            // SPxBasisBase<R>::load(desc());
            // not needed, because load(this) allready loads descriptor
         }

         factorized = false;
         m_numCycle = 0;
#endif
         SPX_MSG_INFO3((*spxout), (*spxout) << "Switching to "
                       << static_cast<const char*>((tp == LEAVE)
                             ? "leaving" : "entering")
                       << " algorithm" << std::endl;)
      }
   }